

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall btDbvtBroadphase::resetPool(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  btDbvt *in_RDI;
  int i;
  int totalObjects;
  int local_18;
  
  if (*(int *)&in_RDI->field_0x1c + *(int *)&in_RDI[1].field_0x1c == 0) {
    btDbvt::clear(in_RDI);
    btDbvt::clear(in_RDI);
    in_RDI[2].m_rayTestStack.field_0x1d = 0;
    in_RDI[2].m_rayTestStack.field_0x1e = 1;
    *(undefined4 *)&in_RDI[2].m_stkStack.field_0xc = 0;
    *(undefined4 *)&in_RDI[2].m_rayTestStack = 0;
    *(undefined4 *)&in_RDI[2].m_stkStack.m_data = 1;
    *(undefined4 *)((long)&in_RDI[2].m_stkStack.m_data + 4) = 0;
    *(undefined4 *)&in_RDI[2].m_stkStack.m_ownsMemory = 10;
    *(undefined4 *)&in_RDI[2].m_stkStack.field_0x1c = 1;
    in_RDI[2].m_rayTestStack.m_size = 0;
    in_RDI[2].m_rayTestStack.m_capacity = 0;
    *(undefined4 *)&in_RDI[2].m_rayTestStack.field_0xc = 0;
    *(undefined4 *)&in_RDI[2].m_rayTestStack.m_ownsMemory = 0;
    *(undefined4 *)&in_RDI[2].m_rayTestStack.m_data = 0;
    *(undefined4 *)((long)&in_RDI[2].m_rayTestStack.m_data + 4) = 0;
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      (&in_RDI[2].m_free)[local_18] = (btDbvtNode *)0x0;
    }
  }
  return;
}

Assistant:

void btDbvtBroadphase::resetPool(btDispatcher* dispatcher)
{
	
	int totalObjects = m_sets[0].m_leaves + m_sets[1].m_leaves;
	if (!totalObjects)
	{
		//reset internal dynamic tree data structures
		m_sets[0].clear();
		m_sets[1].clear();
		
		m_deferedcollide	=	false;
		m_needcleanup		=	true;
		m_stageCurrent		=	0;
		m_fixedleft			=	0;
		m_fupdates			=	1;
		m_dupdates			=	0;
		m_cupdates			=	10;
		m_newpairs			=	1;
		m_updates_call		=	0;
		m_updates_done		=	0;
		m_updates_ratio		=	0;
		
		m_gid				=	0;
		m_pid				=	0;
		m_cid				=	0;
		for(int i=0;i<=STAGECOUNT;++i)
		{
			m_stageRoots[i]=0;
		}
	}
}